

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzread.c
# Opt level: O0

int gz_decomp(gz_statep state)

{
  int iVar1;
  uLong uVar2;
  bool local_49;
  char *local_48;
  z_streamp strm;
  unsigned_long len;
  unsigned_long crc;
  uint had;
  int ret;
  gz_statep state_local;
  
  crc._0_4_ = (state->strm).avail_out;
  _had = state;
  do {
    if (((state->strm).avail_in == 0) && (iVar1 = gz_avail(_had), iVar1 == -1)) {
      return -1;
    }
    if ((state->strm).avail_in == 0) {
      gz_error(_had,-3,"unexpected end of file");
      return -1;
    }
    crc._4_4_ = inflate(&state->strm,0);
    if ((crc._4_4_ == -2) || (crc._4_4_ == 2)) {
      gz_error(_had,-2,"internal error: inflate stream corrupt");
      return -1;
    }
    if (crc._4_4_ == -4) {
      gz_error(_had,-4,"out of memory");
      return -1;
    }
    if (crc._4_4_ == -3) {
      if ((state->strm).msg == (char *)0x0) {
        local_48 = "compressed data error";
      }
      else {
        local_48 = (state->strm).msg;
      }
      gz_error(_had,-3,local_48);
      return -1;
    }
    local_49 = (state->strm).avail_out != 0 && crc._4_4_ != 1;
  } while (local_49);
  _had->have = (uInt)crc - (state->strm).avail_out;
  _had->next = (state->strm).next_out + -(ulong)_had->have;
  uVar2 = crc32((state->strm).adler,_had->next,_had->have);
  (state->strm).adler = uVar2;
  if (crc._4_4_ == 1) {
    iVar1 = gz_next4(_had,&len);
    if ((iVar1 == -1) || (iVar1 = gz_next4(_had,(unsigned_long *)&strm), iVar1 == -1)) {
      gz_error(_had,-3,"unexpected end of file");
      return -1;
    }
    if (len != (state->strm).adler) {
      gz_error(_had,-3,"incorrect data check");
      return -1;
    }
    if (strm != (z_streamp)((state->strm).total_out & 0xffffffff)) {
      gz_error(_had,-3,"incorrect length check");
      return -1;
    }
    _had->how = 0;
  }
  return 0;
}

Assistant:

local int gz_decomp(gz_statep state)
{
    int ret;
    unsigned had;
    unsigned long crc, len;
    z_streamp strm = &(state->strm);

    /* fill output buffer up to end of deflate stream */
    had = strm->avail_out;
    do {
        /* get more input for inflate() */
        if (strm->avail_in == 0 && gz_avail(state) == -1)
            return -1;
        if (strm->avail_in == 0) {
            gz_error(state, Z_DATA_ERROR, "unexpected end of file");
            return -1;
        }

        /* decompress and handle errors */
        ret = inflate(strm, Z_NO_FLUSH);
        if (ret == Z_STREAM_ERROR || ret == Z_NEED_DICT) {
            gz_error(state, Z_STREAM_ERROR,
                      "internal error: inflate stream corrupt");
            return -1;
        }
        if (ret == Z_MEM_ERROR) {
            gz_error(state, Z_MEM_ERROR, "out of memory");
            return -1;
        }
        if (ret == Z_DATA_ERROR) {              /* deflate stream invalid */
            gz_error(state, Z_DATA_ERROR,
                      strm->msg == NULL ? "compressed data error" : strm->msg);
            return -1;
        }
    } while (strm->avail_out && ret != Z_STREAM_END);

    /* update available output and crc check value */
    state->have = had - strm->avail_out;
    state->next = strm->next_out - state->have;
    strm->adler = crc32(strm->adler, state->next, state->have);

    /* check gzip trailer if at end of deflate stream */
    if (ret == Z_STREAM_END) {
        if (gz_next4(state, &crc) == -1 || gz_next4(state, &len) == -1) {
            gz_error(state, Z_DATA_ERROR, "unexpected end of file");
            return -1;
        }
        if (crc != strm->adler) {
            gz_error(state, Z_DATA_ERROR, "incorrect data check");
            return -1;
        }
        if (len != (strm->total_out & 0xffffffffL)) {
            gz_error(state, Z_DATA_ERROR, "incorrect length check");
            return -1;
        }
        state->how = LOOK;      /* ready for next stream, once have is 0 (leave
                                   state->direct unchanged to remember how) */
    }

    /* good decompression */
    return 0;
}